

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_csvmodelserialiser.cpp
# Opt level: O0

void __thiscall
tst_CsvModelSerialiser::basicSaveLoadData(tst_CsvModelSerialiser *this,QObject *parent)

{
  QTestData *pQVar1;
  QStringListModel *this_00;
  QStandardItemModel *this_01;
  tst_SerialiserCommon *this_02;
  QAbstractItemModel *local_68;
  QAbstractItemModel *local_60;
  QStandardItemModel *local_58;
  QAbstractItemModel *local_50;
  QAbstractItemModel *local_48;
  QAbstractItemModel *local_40 [3];
  QStringListModel *local_28;
  QAbstractItemModel *local_20;
  QObject *local_18;
  QObject *parent_local;
  tst_CsvModelSerialiser *this_local;
  
  local_18 = parent;
  parent_local = &this->super_QObject;
  QTest::addColumn<QAbstractItemModel_const*>("sourceModel",(QAbstractItemModel **)0x0);
  QTest::addColumn<QAbstractItemModel*>("destinationModel",(QAbstractItemModel **)0x0);
  pQVar1 = (QTestData *)QTest::newRow("List Single Role");
  local_20 = tst_SerialiserCommon::createStringModel
                       (&this->super_tst_SerialiserCommon,&this->super_QObject);
  pQVar1 = operator<<(pQVar1,&local_20);
  this_00 = (QStringListModel *)operator_new(0x28);
  QStringListModel::QStringListModel(this_00,&this->super_QObject);
  local_28 = this_00;
  operator<<(pQVar1,(QAbstractItemModel **)&local_28);
  pQVar1 = (QTestData *)QTest::newRow("List Single Role Overwrite");
  this_02 = &this->super_tst_SerialiserCommon;
  local_40[0] = tst_SerialiserCommon::createStringModel(this_02,&this->super_QObject);
  pQVar1 = operator<<(pQVar1,local_40);
  local_48 = tst_SerialiserCommon::createStringModel(this_02,&this->super_QObject);
  operator<<(pQVar1,&local_48);
  pQVar1 = (QTestData *)QTest::newRow("Table Single Role");
  local_50 = tst_SerialiserCommon::createComplexModel(this_02,false,false,&this->super_QObject);
  pQVar1 = operator<<(pQVar1,&local_50);
  this_01 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(this_01,&this->super_QObject);
  local_58 = this_01;
  operator<<(pQVar1,(QAbstractItemModel **)&local_58);
  pQVar1 = (QTestData *)QTest::newRow("Table Single Role Overwrite");
  local_60 = tst_SerialiserCommon::createComplexModel
                       (&this->super_tst_SerialiserCommon,false,false,&this->super_QObject);
  pQVar1 = operator<<(pQVar1,&local_60);
  local_68 = tst_SerialiserCommon::createComplexModel
                       (&this->super_tst_SerialiserCommon,false,false,&this->super_QObject);
  operator<<(pQVar1,&local_68);
  return;
}

Assistant:

void tst_CsvModelSerialiser::basicSaveLoadData(QObject *parent)
{
    Q_UNUSED(parent)
    QTest::addColumn<const QAbstractItemModel *>("sourceModel");
    QTest::addColumn<QAbstractItemModel *>("destinationModel");
    QTest::newRow("List Single Role") << static_cast<const QAbstractItemModel *>(createStringModel(this))
                                      << static_cast<QAbstractItemModel *>(new QStringListModel(this));
    QTest::newRow("List Single Role Overwrite") << static_cast<const QAbstractItemModel *>(createStringModel(this)) << createStringModel(this);
#ifdef COMPLEX_MODEL_SUPPORT
    QTest::newRow("Table Single Role") << static_cast<const QAbstractItemModel *>(createComplexModel(false, false, this))
                                       << static_cast<QAbstractItemModel *>(new ComplexModel(this));
    QTest::newRow("Table Single Role Overwrite") << static_cast<const QAbstractItemModel *>(createComplexModel(false, false, this))
                                                 << createComplexModel(false, false, this);
#endif
}